

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall jaegertracing::net::URI_queryUnescape_Test::TestBody(URI_queryUnescape_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_230 [8];
  Message local_228 [15];
  allocator local_219;
  string local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  Message local_1c0 [15];
  allocator local_1b1;
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158 [15];
  allocator local_149;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0 [15];
  allocator local_e1;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88 [8];
  Message local_80 [31];
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  URI_queryUnescape_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"hello%20world",&local_61);
  jaegertracing::net::URI::queryUnescape((string *)&local_40);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"hello world\"","URI::queryUnescape(\"hello%20world\")",
             (char (*) [12])"hello world",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    testing::Message::~Message(local_80);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"hello%2world",&local_e1);
    jaegertracing::net::URI::queryUnescape((string *)&local_c0);
    testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
              ((EqHelper<false> *)local_a0,"\"hello%2world\"","URI::queryUnescape(\"hello%2world\")"
               ,(char (*) [13])"hello%2world",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x42,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_f0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"hello%world",&local_149);
      jaegertracing::net::URI::queryUnescape((string *)&local_128);
      testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                ((EqHelper<false> *)local_108,"\"hello%world\"",
                 "URI::queryUnescape(\"hello%world\")",(char (*) [12])"hello%world",&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
      if (!bVar1) {
        testing::Message::Message(local_158);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x43,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_158);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b0,"hello w%6Frld",&local_1b1);
        jaegertracing::net::URI::queryUnescape((string *)&local_190);
        testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                  ((EqHelper<false> *)local_170,"\"hello world\"",
                   "URI::queryUnescape(\"hello w%6Frld\")",(char (*) [12])"hello world",&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(local_1c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                     ,0x44,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_1c0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(local_1c0);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_218,"hello w%6frld",&local_219);
          jaegertracing::net::URI::queryUnescape((string *)&local_1f8);
          testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                    ((EqHelper<false> *)local_1d8,"\"hello world\"",
                     "URI::queryUnescape(\"hello w%6frld\")",(char (*) [12])"hello world",&local_1f8
                    );
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator((allocator<char> *)&local_219);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar1) {
            testing::Message::Message(local_228);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
            testing::internal::AssertHelper::AssertHelper
                      (local_230,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                       ,0x45,pcVar2);
            testing::internal::AssertHelper::operator=(local_230,local_228);
            testing::internal::AssertHelper::~AssertHelper(local_230);
            testing::Message::~Message(local_228);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(URI, queryUnescape)
{
    ASSERT_EQ("hello world", URI::queryUnescape("hello%20world"));
    ASSERT_EQ("hello%2world", URI::queryUnescape("hello%2world"));
    ASSERT_EQ("hello%world", URI::queryUnescape("hello%world"));
    ASSERT_EQ("hello world", URI::queryUnescape("hello w%6Frld"));
    ASSERT_EQ("hello world", URI::queryUnescape("hello w%6frld"));
}